

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

char * __thiscall
google::protobuf::MethodDescriptorProto::_InternalParse
          (MethodDescriptorProto *this,char *ptr,ParseContext *ctx)

{
  InternalMetadata *this_00;
  ArenaStringPtr *this_01;
  ArenaStringPtr *this_02;
  ArenaStringPtr *this_03;
  byte bVar1;
  bool bVar2;
  MethodOptions *msg;
  ArenaStringPtr *field_name;
  ulong uVar3;
  char *pcVar4;
  Arena *pAVar5;
  UnknownFieldSet *unknown;
  byte *p;
  internal *this_04;
  char cVar6;
  uint uVar7;
  string *psVar8;
  pair<const_char_*,_unsigned_int> pVar9;
  pair<const_char_*,_unsigned_long> pVar10;
  StringPiece str;
  uint local_3c;
  byte *local_38;
  char *ptr_local;
  char *size;
  
  local_38 = (byte *)ptr;
  bVar2 = internal::EpsCopyInputStream::DoneWithCheck
                    (&ctx->super_EpsCopyInputStream,(char **)&local_38,ctx->group_depth_);
  local_3c = 0;
  if (!bVar2) {
    this_00 = &(this->super_Message).super_MessageLite._internal_metadata_;
    this_01 = &this->output_type_;
    this_02 = &this->input_type_;
    this_03 = &this->name_;
    local_3c = 0;
    do {
      bVar1 = *local_38;
      uVar7 = (uint)bVar1;
      p = local_38 + 1;
      if ((char)bVar1 < '\0') {
        uVar7 = ((uint)bVar1 + (uint)*p * 0x80) - 0x80;
        if (-1 < (char)*p) {
          p = local_38 + 2;
          goto LAB_0029de09;
        }
        pVar9 = internal::ReadTagFallback((char *)local_38,uVar7);
        p = (byte *)pVar9.first;
        if (p != (byte *)0x0) {
          uVar7 = pVar9.second;
          goto LAB_0029de09;
        }
LAB_0029e19f:
        local_38 = (byte *)0x0;
        break;
      }
LAB_0029de09:
      cVar6 = (char)uVar7;
      local_38 = p;
      switch(uVar7 >> 3) {
      case 1:
        if (cVar6 != '\n') break;
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
        pAVar5 = (Arena *)(this->super_Message).super_MessageLite._internal_metadata_.ptr_;
        if (((ulong)pAVar5 & 1) != 0) {
          pAVar5 = *(Arena **)((ulong)pAVar5 & 0xfffffffffffffffe);
        }
        psVar8 = this_03->ptr_;
        field_name = this_03;
        if (psVar8 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
          internal::ArenaStringPtr::CreateInstance
                    (this_03,pAVar5,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
          psVar8 = this_03->ptr_;
        }
        local_38 = (byte *)internal::InlineGreedyStringParser(psVar8,(char *)local_38,ctx);
        this_04 = (internal *)(psVar8->_M_dataplus)._M_p;
        size = (char *)psVar8->_M_string_length;
        if ((long)size < 0) {
          StringPiece::LogFatalSizeTooBig((size_t)size,"size_t to int conversion");
        }
        pcVar4 = "google.protobuf.MethodDescriptorProto.name";
LAB_0029e041:
        str.length_ = (stringpiece_ssize_type)pcVar4;
        str.ptr_ = size;
        internal::VerifyUTF8(this_04,str,(char *)field_name);
        goto joined_r0x0029e0e5;
      case 2:
        if (cVar6 == '\x12') {
          *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
          pAVar5 = (Arena *)(this->super_Message).super_MessageLite._internal_metadata_.ptr_;
          if (((ulong)pAVar5 & 1) != 0) {
            pAVar5 = *(Arena **)((ulong)pAVar5 & 0xfffffffffffffffe);
          }
          psVar8 = this_02->ptr_;
          field_name = this_02;
          if (psVar8 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
            internal::ArenaStringPtr::CreateInstance
                      (this_02,pAVar5,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
            psVar8 = this_02->ptr_;
          }
          local_38 = (byte *)internal::InlineGreedyStringParser(psVar8,(char *)local_38,ctx);
          this_04 = (internal *)(psVar8->_M_dataplus)._M_p;
          size = (char *)psVar8->_M_string_length;
          if ((long)size < 0) {
            StringPiece::LogFatalSizeTooBig((size_t)size,"size_t to int conversion");
          }
          pcVar4 = "google.protobuf.MethodDescriptorProto.input_type";
          goto LAB_0029e041;
        }
        break;
      case 3:
        if (cVar6 == '\x1a') {
          *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 4;
          pAVar5 = (Arena *)(this->super_Message).super_MessageLite._internal_metadata_.ptr_;
          if (((ulong)pAVar5 & 1) != 0) {
            pAVar5 = *(Arena **)((ulong)pAVar5 & 0xfffffffffffffffe);
          }
          psVar8 = this_01->ptr_;
          field_name = this_01;
          if (psVar8 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
            internal::ArenaStringPtr::CreateInstance
                      (this_01,pAVar5,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
            psVar8 = this_01->ptr_;
          }
          local_38 = (byte *)internal::InlineGreedyStringParser(psVar8,(char *)local_38,ctx);
          this_04 = (internal *)(psVar8->_M_dataplus)._M_p;
          size = (char *)psVar8->_M_string_length;
          if ((long)size < 0) {
            StringPiece::LogFatalSizeTooBig((size_t)size,"size_t to int conversion");
          }
          pcVar4 = "google.protobuf.MethodDescriptorProto.output_type";
          goto LAB_0029e041;
        }
        break;
      case 4:
        if (cVar6 == '\"') {
          *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 8;
          msg = this->options_;
          if (msg == (MethodOptions *)0x0) {
            pAVar5 = (Arena *)this_00->ptr_;
            if (((ulong)pAVar5 & 1) != 0) {
              pAVar5 = *(Arena **)((ulong)pAVar5 & 0xfffffffffffffffe);
            }
            msg = Arena::CreateMaybeMessage<google::protobuf::MethodOptions>(pAVar5);
            this->options_ = msg;
          }
          local_38 = (byte *)internal::ParseContext::ParseMessage<google::protobuf::MethodOptions>
                                       (ctx,msg,(char *)local_38);
          goto joined_r0x0029e0e5;
        }
        break;
      case 5:
        if (cVar6 != '(') break;
        local_3c = local_3c | 0x10;
        uVar3 = (ulong)(char)*p;
        local_38 = p + 1;
        if ((long)uVar3 < 0) {
          uVar7 = ((uint)*local_38 * 0x80 + (uint)*p) - 0x80;
          if ((char)*local_38 < '\0') {
            local_38 = p;
            pVar10 = internal::VarintParseSlow64((char *)p,uVar7);
            local_38 = (byte *)pVar10.first;
            this->client_streaming_ = pVar10.second != 0;
            goto joined_r0x0029e0e5;
          }
          uVar3 = (ulong)uVar7;
          local_38 = p + 2;
        }
        this->client_streaming_ = uVar3 != 0;
        goto LAB_0029e0eb;
      case 6:
        if (cVar6 == '0') {
          local_3c = local_3c | 0x20;
          uVar3 = (ulong)(char)*p;
          local_38 = p + 1;
          if ((long)uVar3 < 0) {
            uVar7 = ((uint)*local_38 * 0x80 + (uint)*p) - 0x80;
            if ((char)*local_38 < '\0') {
              local_38 = p;
              pVar10 = internal::VarintParseSlow64((char *)p,uVar7);
              local_38 = (byte *)pVar10.first;
              this->server_streaming_ = pVar10.second != 0;
              goto joined_r0x0029e0e5;
            }
            uVar3 = (ulong)uVar7;
            local_38 = p + 2;
          }
          this->server_streaming_ = uVar3 != 0;
          goto LAB_0029e0eb;
        }
      }
      if ((uVar7 == 0) || ((uVar7 & 7) == 4)) {
        (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = uVar7 - 1;
        break;
      }
      if (((ulong)this_00->ptr_ & 1) == 0) {
        unknown = internal::InternalMetadata::
                  mutable_unknown_fields_slow<google::protobuf::UnknownFieldSet>(this_00);
      }
      else {
        unknown = (UnknownFieldSet *)(((ulong)this_00->ptr_ & 0xfffffffffffffffe) + 8);
      }
      local_38 = (byte *)internal::UnknownFieldParse((ulong)uVar7,unknown,(char *)local_38,ctx);
joined_r0x0029e0e5:
      if (local_38 == (byte *)0x0) goto LAB_0029e19f;
LAB_0029e0eb:
      bVar2 = internal::EpsCopyInputStream::DoneWithCheck
                        (&ctx->super_EpsCopyInputStream,(char **)&local_38,ctx->group_depth_);
    } while (!bVar2);
  }
  (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | local_3c;
  return (char *)local_38;
}

Assistant:

const char* MethodDescriptorProto::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  ::PROTOBUF_NAMESPACE_ID::Arena* arena = GetArena(); (void)arena;
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // optional string name = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 10)) {
          auto str = _internal_mutable_name();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          #ifndef NDEBUG
          ::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, "google.protobuf.MethodDescriptorProto.name");
          #endif  // !NDEBUG
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional string input_type = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 18)) {
          auto str = _internal_mutable_input_type();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          #ifndef NDEBUG
          ::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, "google.protobuf.MethodDescriptorProto.input_type");
          #endif  // !NDEBUG
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional string output_type = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 26)) {
          auto str = _internal_mutable_output_type();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          #ifndef NDEBUG
          ::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, "google.protobuf.MethodDescriptorProto.output_type");
          #endif  // !NDEBUG
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional .google.protobuf.MethodOptions options = 4;
      case 4:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 34)) {
          ptr = ctx->ParseMessage(_internal_mutable_options(), ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional bool client_streaming = 5 [default = false];
      case 5:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 40)) {
          _Internal::set_has_client_streaming(&has_bits);
          client_streaming_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional bool server_streaming = 6 [default = false];
      case 6:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 48)) {
          _Internal::set_has_server_streaming(&has_bits);
          server_streaming_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
        ptr = UnknownFieldParse(tag,
            _internal_metadata_.mutable_unknown_fields<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(),
            ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}